

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForOneof
          (Generator *this,OneofDescriptor *oneof)

{
  int iVar1;
  SubstituteArg *in_stack_fffffffffffffd98;
  string local_260;
  string oneof_options;
  string oneof_name;
  string local_200;
  undefined1 local_1d0 [48];
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  SubstituteArg local_80;
  SubstituteArg local_50;
  
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"OneofOptions","");
  MessageLite::SerializeAsString_abi_cxx11_((string *)local_1d0,*(MessageLite **)(oneof + 0x28));
  OptionsValue(&oneof_options,this,&local_200,(string *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  iVar1 = std::__cxx11::string::compare((char *)&oneof_options);
  if (iVar1 != 0) {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              (&local_260,this,*(Descriptor **)(oneof + 0x10));
    local_200._M_dataplus._M_p = local_260._M_dataplus._M_p;
    local_200._M_string_length._0_4_ = (undefined4)local_260._M_string_length;
    local_1d0._0_8_ = "oneofs_by_name";
    local_1d0._8_4_ = 0xe;
    local_50.text_ = (char *)**(undefined8 **)oneof;
    local_50.size_ = *(int *)(*(undefined8 **)oneof + 1);
    local_80.text_ = (char *)0x0;
    local_80.size_ = -1;
    local_b0.text_ = (char *)0x0;
    local_b0.size_ = -1;
    local_e0.text_ = (char *)0x0;
    local_e0.size_ = -1;
    local_110.text_ = (char *)0x0;
    local_110.size_ = -1;
    local_140.text_ = (char *)0x0;
    local_140.size_ = -1;
    local_170.text_ = (char *)0x0;
    local_170.size_ = -1;
    local_1a0.text_ = (char *)0x0;
    local_1a0.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&oneof_name,(strings *)"$0.$1[\'$2\']",(char *)&local_200,(SubstituteArg *)local_1d0,
               &local_50,&local_80,&local_b0,&local_e0,&local_110,&local_140,&local_170,&local_1a0,
               in_stack_fffffffffffffd98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    io::Printer::Print(this->printer_,
                       "$descriptor$.has_options = True\n$descriptor$._options = $options$\n",
                       "descriptor",&oneof_name,"options",&oneof_options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)oneof_name._M_dataplus._M_p != &oneof_name.field_2) {
      operator_delete(oneof_name._M_dataplus._M_p,oneof_name.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)oneof_options._M_dataplus._M_p != &oneof_options.field_2) {
    operator_delete(oneof_options._M_dataplus._M_p,oneof_options.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Generator::FixOptionsForOneof(const OneofDescriptor& oneof) const {
  string oneof_options = OptionsValue(
      "OneofOptions", oneof.options().SerializeAsString());
  if (oneof_options != "None") {
    string oneof_name = strings::Substitute(
        "$0.$1['$2']",
        ModuleLevelDescriptorName(*oneof.containing_type()),
        "oneofs_by_name", oneof.name());
    PrintDescriptorOptionsFixingCode(oneof_name, oneof_options, printer_);
  }
}